

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

size_t quicly_send_version_negotiation
                 (quicly_context_t *ctx,ptls_iovec_t dest_cid,ptls_iovec_t src_cid,
                 uint32_t *versions,void *payload)

{
  uint uVar1;
  size_t __n;
  ulong __n_00;
  uint *puVar2;
  undefined1 *__dest;
  uint *__dest_00;
  
  __n = dest_cid.len;
  __n_00 = src_cid.len;
  (*ctx->tls->random_bytes)(payload,1);
  *(byte *)payload = *payload | 0x80;
  __dest = (undefined1 *)((long)payload + 6);
  *(undefined4 *)((long)payload + 1) = 0;
  *(char *)((long)payload + 5) = (char)dest_cid.len;
  if (__n != 0) {
    memcpy(__dest,dest_cid.base,__n);
    __dest = __dest + __n;
  }
  *__dest = (char)src_cid.len;
  __dest_00 = (uint *)(__dest + 1);
  if (__n_00 != 0) {
    memcpy(__dest_00,src_cid.base,__n_00);
    __dest_00 = (uint *)((long)__dest_00 + __n_00);
  }
  uVar1 = *versions;
  if (uVar1 != 0) {
    puVar2 = versions + 1;
    do {
      *__dest_00 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      __dest_00 = __dest_00 + 1;
      uVar1 = *puVar2;
      puVar2 = puVar2 + 1;
    } while (uVar1 != 0);
  }
  uVar1 = 0xa0a0a0a;
  if (3 < __n_00) {
    uVar1 = *(uint *)src_cid.base & 0xf0f0f0f0 | 0xa0a0a0a;
  }
  *__dest_00 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return (long)__dest_00 + (4 - (long)payload);
}

Assistant:

size_t quicly_send_version_negotiation(quicly_context_t *ctx, ptls_iovec_t dest_cid, ptls_iovec_t src_cid, const uint32_t *versions,
                                       void *payload)
{
    uint8_t *dst = payload;

    /* type_flags */
    ctx->tls->random_bytes(dst, 1);
    *dst |= QUICLY_LONG_HEADER_BIT;
    ++dst;
    /* version */
    dst = quicly_encode32(dst, 0);
    /* connection-id */
    *dst++ = dest_cid.len;
    if (dest_cid.len != 0) {
        memcpy(dst, dest_cid.base, dest_cid.len);
        dst += dest_cid.len;
    }
    *dst++ = src_cid.len;
    if (src_cid.len != 0) {
        memcpy(dst, src_cid.base, src_cid.len);
        dst += src_cid.len;
    }
    /* supported_versions */
    for (const uint32_t *v = versions; *v != 0; ++v)
        dst = quicly_encode32(dst, *v);
    /* add a greasing version. This also covers the case where an empty list is specified by the caller to indicate rejection. */
    uint32_t grease_version = 0;
    if (src_cid.len >= sizeof(grease_version))
        memcpy(&grease_version, src_cid.base, sizeof(grease_version));
    grease_version = (grease_version & 0xf0f0f0f0) | 0x0a0a0a0a;
    dst = quicly_encode32(dst, grease_version);

    return dst - (uint8_t *)payload;
}